

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_syntax.cpp
# Opt level: O3

ParserState * giveup_to_expected(ParserState *__return_storage_ptr__,ParserState *state,char *what)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined8 uVar3;
  storage<ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_> *psVar4;
  bool bVar5;
  undefined7 extraout_var;
  ParserState *extraout_RAX;
  char **in_RCX;
  ParserState *pPVar7;
  ParserState *pPVar8;
  anon_class_1_0_00000001 local_c9;
  ParserState *local_c8;
  undefined1 local_c0 [16];
  undefined1 local_b0 [48];
  undefined1 local_80 [56];
  undefined8 local_48;
  undefined8 uStack_40;
  ParserState *pPVar6;
  
  local_80._16_8_ = what;
  bVar5 = eggs::variants::detail::
          apply<bool,is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,false,false>const&>
                    (&local_c9,&state->_storage);
  pPVar6 = (ParserState *)CONCAT71(extraout_var,bVar5);
  if (bVar5) {
    eggs::variants::detail::
    _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    ::_storage((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)__return_storage_ptr__,
               (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                *)state);
    pPVar6 = extraout_RAX;
  }
  else {
    *(undefined8 *)
     &(__return_storage_ptr__->_storage).
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
      .
      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
      .
      super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
      .field_0 = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->_storage).
             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
             .
             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
             .
             super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
             .field_0 + 8) = 0;
    (__return_storage_ptr__->_storage).
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
    .
    super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
    ._which = 1;
    local_c8 = __return_storage_ptr__;
    if ((state->_storage).
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
        .
        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
        ._which != 2) {
      eggs::variants::detail::throw_bad_variant_access<llvm_vecsmall::SmallVector<ParserError,1u>&>
                ();
    }
    puVar1 = *(undefined1 **)
              &(state->_storage).
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
               .
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
               .
               super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
               .field_0;
    puVar2 = *(undefined1 **)
              ((long)&(state->_storage).
                      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                      .
                      super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                      .
                      super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
                      .field_0 + 8);
    if (puVar1 != puVar2) {
      pPVar8 = (ParserState *)(puVar1 + 0x20);
      do {
        if (*(int *)((long)&pPVar8[-1]._storage.
                            super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                            .
                            super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                            .
                            super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
                            .field_0 + 0x38) == 0) {
          uVar3 = *(undefined8 *)
                   ((long)&pPVar8[-1]._storage.
                           super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                           .
                           super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                           .
                           super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
                           .field_0 + 0x40);
          fmt::format<char_const*>
                    ((string *)local_c0,(fmt *)"expected {}",(CStringRef)(local_80 + 0x10),in_RCX);
          __return_storage_ptr__ = local_c8;
          local_b0._16_4_ = 1;
          if ((ParserState *)local_c0._0_8_ == (ParserState *)local_b0) {
            local_80._8_8_ = local_b0._8_8_;
            local_b0._32_8_ = (ParserState *)local_80;
          }
          else {
            local_b0._32_8_ = local_c0._0_8_;
          }
          local_80._1_7_ = local_b0._1_7_;
          local_80[0] = local_b0[0];
          local_b0._40_8_ = local_c0._8_8_;
          local_c0._8_8_ = 0;
          local_b0[0] = '\0';
          local_c0._0_8_ = (ParserState *)local_b0;
          local_b0._24_8_ = uVar3;
          add_error(local_c8,(ParserError *)(local_b0 + 0x10));
          if ((ParserState *)local_b0._32_8_ != (ParserState *)local_80) {
            operator_delete((void *)local_b0._32_8_,local_80._0_8_ + 1);
          }
          pPVar6 = (ParserState *)local_b0;
          pPVar7 = (ParserState *)local_c0._0_8_;
          if ((ParserState *)local_c0._0_8_ != (ParserState *)local_b0) goto LAB_0019677d;
        }
        else {
          local_80._24_8_ =
               *(undefined8 *)
                ((long)&pPVar8[-1]._storage.
                        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                        .
                        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                        .
                        super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
                        .field_0 + 0x38);
          local_80._32_8_ =
               *(undefined8 *)
                ((long)&pPVar8[-1]._storage.
                        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                        .
                        super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                        .
                        super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
                        .field_0 + 0x40);
          local_80._40_8_ =
               *(long *)((long)&pPVar8[-1]._storage.
                                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                                .
                                super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                                .
                                super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
                                .field_0 + 0x48);
          if (pPVar8 == (ParserState *)local_80._40_8_) {
            local_48 = *(undefined8 *)
                        &(pPVar8->_storage).
                         super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                         .
                         super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                         .
                         super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
                         .field_0;
            uStack_40 = *(undefined8 *)
                         ((long)&(pPVar8->_storage).
                                 super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                                 .
                                 super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                                 .
                                 super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
                                 .field_0 + 8);
            local_80._40_8_ = (ParserState *)&stack0xffffffffffffffb8;
          }
          else {
            local_48 = *(undefined8 *)
                        &(pPVar8->_storage).
                         super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                         .
                         super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                         .
                         super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
                         .field_0;
          }
          local_80._48_8_ =
               pPVar8[-1]._storage.
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
               .
               super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
               ._which;
          *(ParserState **)
           ((long)&pPVar8[-1]._storage.
                   super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                   .
                   super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                   .
                   super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
                   .field_0 + 0x48) = pPVar8;
          pPVar8[-1]._storage.
          super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
          .
          super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
          ._which = 0;
          (pPVar8->_storage).
          super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
          .
          super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
          .
          super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
          .field_0._target = '\0';
          add_error(__return_storage_ptr__,(ParserError *)(local_80 + 0x18));
          pPVar6 = (ParserState *)&stack0xffffffffffffffb8;
          pPVar7 = (ParserState *)local_80._40_8_;
          if ((ParserState *)local_80._40_8_ != (ParserState *)&stack0xffffffffffffffb8) {
LAB_0019677d:
            operator_delete(pPVar7,*(long *)&(pPVar6->_storage).
                                             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                                             .
                                             super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                                             .
                                             super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
                                             .field_0 + 1);
          }
        }
        pPVar6 = (ParserState *)
                 ((long)&(pPVar8->_storage).
                         super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                         .
                         super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                         .
                         super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
                         .field_0 + 0x30);
        psVar4 = &pPVar8->_storage;
        pPVar8 = pPVar6;
      } while ((undefined1 *)
               ((long)&(psVar4->
                       super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false,_true>
                       ).
                       super__storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_true,_true>
                       .
                       super__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_ParserSuccess,_llvm_vecsmall::SmallVector<ParserError,_1U>_>,_false>
                       .field_0 + 0x10) != puVar2);
    }
  }
  return pPVar6;
}

Assistant:

static ParserState giveup_to_expected(ParserState state, const char* what)
{
    if(!is<ParserSuccess>(state))
    {
        ParserState new_state = ParserSuccess(nullptr);
        for(auto& e : get<ParserFailure>(state))
        {
            if(e.state == ParserStatus::GiveUp)
                add_error(new_state, ParserError(ParserStatus::Error, e.context, fmt::format("expected {}", what)));
            else
                add_error(new_state, std::move(e));
        }
        return new_state;
    }
    return state;
}